

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgflusher.cc
# Opt level: O0

void bgflusher_switch_file(filemgr *old_file,filemgr *new_file,err_log_callback *log_callback)

{
  avl_node *paVar1;
  avl_node *in_RSI;
  undefined8 *in_RDI;
  openfiles_elem *elem;
  openfiles_elem query;
  avl_node *a;
  avl_cmp_func *in_stack_fffffffffffffab8;
  avl_node *in_stack_fffffffffffffac0;
  avl_tree *in_stack_fffffffffffffac8;
  avl_node *in_stack_fffffffffffffad0;
  avl_node *in_stack_fffffffffffffad8;
  avl_tree *in_stack_fffffffffffffae0;
  
  if (bgflusher_initialized != '\0') {
    strcpy(&stack0xfffffffffffffab8,(char *)*in_RDI);
    pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
    paVar1 = avl_search(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                        in_stack_fffffffffffffab8);
    if (paVar1 == (avl_node *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
    }
    else {
      avl_remove(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      strcpy((char *)(paVar1 + -0x36),(char *)in_RSI->parent);
      paVar1[-0xc].right = in_RSI;
      *(undefined4 *)&paVar1[-1].left = 1;
      *(undefined1 *)((long)&paVar1[-1].left + 4) = 0;
      avl_insert((avl_tree *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                 (avl_cmp_func *)in_stack_fffffffffffffac8);
      pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
    }
  }
  return;
}

Assistant:

void bgflusher_switch_file(struct filemgr *old_file, struct filemgr *new_file,
                           err_log_callback *log_callback)
{
    if (!bgflusher_initialized) return;

    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, old_file->filename);
    mutex_lock(&bgf_lock);
    a = avl_search(&openfiles, &query.avl, _bgflusher_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        avl_remove(&openfiles, a);
        strcpy(elem->filename, new_file->filename);
        elem->file = new_file;
        elem->register_count = 1;
        elem->background_flush_in_progress = false;
        avl_insert(&openfiles, &elem->avl, _bgflusher_cmp);
        mutex_unlock(&bgf_lock);
    } else {
        mutex_unlock(&bgf_lock);
    }
}